

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<unsigned_int>
               (char *label_id,uint *xs,uint *ys,int count,double y_ref,int offset,int stride)

{
  undefined1 local_78 [8];
  GetterXsYRef<unsigned_int> getter2;
  GetterXsYs<unsigned_int> getter1;
  int stride_local;
  int offset_local;
  double y_ref_local;
  int count_local;
  uint *ys_local;
  uint *xs_local;
  char *label_id_local;
  
  GetterXsYs<unsigned_int>::GetterXsYs
            ((GetterXsYs<unsigned_int> *)&getter2.Stride,xs,ys,count,offset,stride);
  GetterXsYRef<unsigned_int>::GetterXsYRef
            ((GetterXsYRef<unsigned_int> *)local_78,xs,y_ref,count,offset,stride);
  PlotShadedEx<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>>
            (label_id,(GetterXsYs<unsigned_int> *)&getter2.Stride,
             (GetterXsYRef<unsigned_int> *)local_78);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys, count, offset, stride);
    GetterXsYRef<T> getter2(xs, y_ref, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}